

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

bool __thiscall stick::Error::operator==(Error *this,Error *_other)

{
  bool local_c9;
  undefined1 local_c8 [8];
  Error b;
  Error a;
  Error *_other_local;
  Error *this_local;
  
  resolvedCode((Error *)&b.m_line,this);
  resolvedCode((Error *)local_c8,_other);
  local_c9 = (int)a.m_category == (int)b.m_category && (undefined1  [8])b._80_8_ == local_c8;
  ~Error((Error *)local_c8);
  ~Error((Error *)&b.m_line);
  return local_c9;
}

Assistant:

bool Error::operator==(const Error & _other) const
{
    Error a = resolvedCode();
    Error b = _other.resolvedCode();
    return a.m_code == b.m_code && a.m_category == b.m_category;
}